

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  sat_solver *psVar1;
  Vec_Wec_t *__ptr;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Hsh_IntMan_t *__ptr_00;
  Vec_Wrd_t *__ptr_01;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    if (psVar1->size < 1) {
      uVar6 = 0;
    }
    else {
      lVar5 = 0;
      uVar6 = 0;
      do {
        if (psVar1->pFreqs[lVar5] != '\0') {
          psVar1->pFreqs[lVar5] = '\0';
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < psVar1->size);
    }
    psVar1 = p->pSat;
    Abc_Print((int)uVar6,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)(int)uVar6 * 100.0) / (double)psVar1->size,(ulong)(uint)psVar1->nLearntStart
              ,(ulong)(uint)psVar1->nLearntDelta,(ulong)(uint)psVar1->nLearntRatio,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)psVar1->size,uVar6);
    Abc_Print(p->nUniProps,
              "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,(ulong)(uint)p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x316,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vVisited;
  if (0 < __ptr->nCap) {
    lVar7 = 8;
    lVar5 = 0;
    do {
      pvVar2 = *(void **)((long)&__ptr->pArray->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&__ptr->pArray->nCap + lVar7) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar5 < __ptr->nCap);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  pVVar3 = p->vMapping;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vMapRefs;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vId2Num;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar4 = p->vId2Var;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar5];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vTerInfo;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        if ((void *)0x2 < pVVar4->pArray[lVar5]) {
          free(pVVar4->pArray[lVar5]);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (void **)0x0;
    }
    free(pVVar4);
  }
  sat_solver_delete(p->pSat);
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar3 = p->vData;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  __ptr_00 = p->vHash;
  pVVar3 = __ptr_00->vTable;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  __ptr_01 = __ptr_00->vObjs;
  if (__ptr_01->pArray != (word *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (word *)0x0;
  }
  if (__ptr_01 != (Vec_Wrd_t *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_00 != (Hsh_IntMan_t *)0x0) {
    free(__ptr_00);
  }
  pVVar3 = p->vId2Lit;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  if (p->pSops[1] != (char *)0x0) {
    free(p->pSops[1]);
    p->pSops[1] = (char *)0x0;
  }
  if (p->pSops != (char **)0x0) {
    free(p->pSops);
    p->pSops = (char **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = sat_solver_count_usedvars(p->pSat);
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat->nLearntStart, p->pSat->nLearntDelta, p->pSat->nLearntRatio, 
            p->pSat->nDBreduces, p->pSat->size, nUsedVars, 100.0*nUsedVars/p->pSat->size );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    sat_solver_delete( p->pSat );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}